

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QMdi::Rearranger_*>::move(QList<QMdi::Rearranger_*> *this,qsizetype from,qsizetype to)

{
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QMdi::Rearranger_*> *in_RDI;
  Rearranger **unaff_retaddr;
  Rearranger **b;
  QArrayDataPointer<QMdi::Rearranger_*> *__last;
  
  if (in_RSI != in_RDX) {
    __last = in_RDI;
    detach((QList<QMdi::Rearranger_*> *)0x618aaa);
    QArrayDataPointer<QMdi::Rearranger_*>::operator->(in_RDI);
    QArrayDataPointer<QMdi::Rearranger_*>::begin((QArrayDataPointer<QMdi::Rearranger_*> *)0x618abb);
    if (in_RSI < in_RDX) {
      std::_V2::rotate<QMdi::Rearranger**>(b,unaff_retaddr,(Rearranger **)__last);
    }
    else {
      std::_V2::rotate<QMdi::Rearranger**>(b,unaff_retaddr,(Rearranger **)__last);
    }
  }
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }